

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_StageSetup(ARKodeMem ark_mem)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    iVar5 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xfdd,"mriStep_StageSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 0xa0);
    puVar3 = *(undefined8 **)((long)pvVar2 + 0x1f8);
    dVar10 = ark_mem->h *
             *(double *)
              (*(long *)((long)pvVar2 + 0x80) +
              (long)*(int *)(*(long *)((long)pvVar2 + 0x68) + (long)(int)uVar1 * 4) * 8);
    puVar4 = *(undefined8 **)((long)pvVar2 + 0x200);
    *(double *)((long)pvVar2 + 0xc0) = dVar10;
    if (ark_mem->firststage == 0) {
      dVar10 = dVar10 / *(double *)((long)pvVar2 + 200);
    }
    else {
      *(double *)((long)pvVar2 + 200) = dVar10;
      dVar10 = 1.0;
    }
    *(double *)((long)pvVar2 + 0xd0) = dVar10;
    *puVar4 = ark_mem->ycur;
    *puVar3 = 0x3ff0000000000000;
    puVar3[1] = 0xbff0000000000000;
    puVar4[1] = *(undefined8 *)((long)pvVar2 + 0x90);
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    iVar5 = 2;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      if ((*(int *)((long)pvVar2 + 0x18) != 0) &&
         (lVar9 = (long)*(int *)(*(long *)((long)pvVar2 + 0x68) + uVar7 * 4), -1 < lVar9)) {
        puVar3[iVar5] = ark_mem->h * *(double *)(*(long *)((long)pvVar2 + 0x78) + lVar9 * 8);
        puVar4[iVar5] = *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + lVar9 * 8);
        iVar5 = iVar5 + 1;
      }
      if ((*(int *)((long)pvVar2 + 0x1c) != 0) &&
         (lVar9 = (long)*(int *)(*(long *)((long)pvVar2 + 0x68) + uVar7 * 4), -1 < lVar9)) {
        puVar3[iVar5] = ark_mem->h * *(double *)(*(long *)((long)pvVar2 + 0x80) + lVar9 * 8);
        puVar4[iVar5] = *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar9 * 8);
        iVar5 = iVar5 + 1;
      }
    }
    iVar6 = N_VLinearCombination(iVar5,puVar3,puVar4,*(undefined8 *)((long)pvVar2 + 0x88));
    iVar5 = -0x1c;
    if (iVar6 == 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int mriStep_StageSetup(ARKodeMem ark_mem)
{
  /* local data */
  ARKodeMRIStepMem step_mem;
  int retval, i, j, nvec;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma (if the method contains an implicit component) */
  step_mem->gamma = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[i]];

  if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
  step_mem->gamrat = (ark_mem->firststage) ? ONE
                                           : step_mem->gamma / step_mem->gammap;

  /* set cvals and Xvecs for setting stage data */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = -ONE;
  Xvecs[1] = step_mem->zpred;
  nvec     = 2;

  for (j = 0; j < i; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      cvals[nvec] = ark_mem->h * step_mem->Ae_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      cvals[nvec] = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}